

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O0

QWidget * __thiscall
QItemEditorFactory::createEditor(QItemEditorFactory *this,int userType,QWidget *parent)

{
  long lVar1;
  int iVar2;
  QItemEditorCreatorBase *pQVar3;
  QItemEditorFactory *pQVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 in_RDX;
  uint in_ESI;
  QItemEditorFactory *in_RDI;
  long in_FS_OFFSET;
  QItemEditorFactory *dfactory;
  QItemEditorCreatorBase *creator;
  QItemEditorCreatorBase **in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  QWidget *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QHash<int,_QItemEditorCreatorBase_*>::value
                     ((QHash<int,_QItemEditorCreatorBase_*> *)in_RDI,in_stack_ffffffffffffffb0,
                      in_stack_ffffffffffffffa8);
  if (pQVar3 == (QItemEditorCreatorBase *)0x0) {
    pQVar4 = defaultFactory();
    if (pQVar4 == in_RDI) {
      local_20 = (QWidget *)0x0;
    }
    else {
      iVar2 = (*pQVar4->_vptr_QItemEditorFactory[2])(pQVar4,(ulong)in_ESI,in_RDX);
      local_20 = (QWidget *)CONCAT44(extraout_var,iVar2);
    }
  }
  else {
    iVar2 = (*pQVar3->_vptr_QItemEditorCreatorBase[2])(pQVar3,in_RDX);
    local_20 = (QWidget *)CONCAT44(extraout_var_00,iVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

QWidget *QItemEditorFactory::createEditor(int userType, QWidget *parent) const
{
    QItemEditorCreatorBase *creator = creatorMap.value(userType, 0);
    if (!creator) {
        const QItemEditorFactory *dfactory = defaultFactory();
        return dfactory == this ? nullptr : dfactory->createEditor(userType, parent);
    }
    return creator->createWidget(parent);
}